

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase445::run(TestCase445 *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  uint *puVar8;
  char *pcVar9;
  undefined8 *puVar10;
  char *macroArgs;
  LogSeverity severity;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *ptrCopy;
  char (*params) [41];
  DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*&>
  *in_R9;
  DestructionOrderRecorder *ptrCopy_3;
  DestructionOrderRecorder *ptrCopy_2;
  uint destroyed1;
  uint destroyed3;
  uint destroyed2;
  DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*&>
  _kjCondition;
  DestructionOrderRecorder *ptrCopy_1;
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  builder;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> combined;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> arr;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *ptr;
  uint counter;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  char *local_b8;
  size_t local_b0;
  bool local_a8;
  long *local_a0;
  long local_98;
  long lStack_90;
  long local_88;
  undefined8 *local_80;
  uint *local_78;
  undefined8 uStack_70;
  undefined8 *local_68;
  uint *local_58;
  undefined8 uStack_50;
  undefined8 *local_48;
  uint *local_40;
  undefined4 local_34;
  
  local_34 = 0;
  local_d4 = 0;
  local_cc = 0;
  local_d0 = 0;
  plVar5 = (long *)operator_new(0x10);
  *plVar5 = (long)&local_34;
  plVar5[1] = (long)&local_d4;
  plVar6 = (long *)operator_new(0x10);
  *plVar6 = (long)&local_34;
  plVar6[1] = (long)&local_cc;
  plVar7 = (long *)operator_new(0x10);
  *plVar7 = (long)&local_34;
  plVar7[1] = (long)&local_d0;
  macroArgs = (char *)0x0;
  params = (char (*) [41])0x0;
  puVar8 = (uint *)_::HeapArrayDisposer::allocateImpl
                             (0x10,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_80 = &_::HeapArrayDisposer::instance;
  *(undefined8 **)puVar8 =
       &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  *(long **)(puVar8 + 2) = plVar5;
  uStack_50 = 1;
  local_48 = &_::HeapArrayDisposer::instance;
  local_98 = 0;
  lStack_90 = 0;
  local_88 = 0;
  local_a0 = plVar7;
  local_58 = puVar8;
  local_40 = puVar8;
  pcVar9 = (char *)operator_new(0x30);
  *(undefined ***)pcVar9 = &PTR___cxa_pure_virtual_00235ed8;
  *(undefined8 **)(pcVar9 + 8) =
       &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  *(long **)(pcVar9 + 0x10) = plVar6;
  *(uint **)(pcVar9 + 0x18) = puVar8;
  pcVar9[0x20] = '\x01';
  pcVar9[0x21] = '\0';
  pcVar9[0x22] = '\0';
  pcVar9[0x23] = '\0';
  pcVar9[0x24] = '\0';
  pcVar9[0x25] = '\0';
  pcVar9[0x26] = '\0';
  pcVar9[0x27] = '\0';
  *(undefined8 **)(pcVar9 + 0x28) = &_::HeapArrayDisposer::instance;
  local_58 = (uint *)0x0;
  uStack_50 = 0;
  *(undefined ***)pcVar9 = &PTR_disposeImpl_00235c90;
  uStack_c0._0_4_ = 1;
  uStack_c0._4_4_ = 0;
  local_c8 = (undefined1  [8])puVar8;
  local_b8 = pcVar9;
  puVar10 = (undefined8 *)operator_new(0x30);
  *puVar10 = &PTR___cxa_pure_virtual_00235ed8;
  puVar10[1] = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar10[2] = local_a0;
  puVar10[3] = puVar8;
  puVar10[4] = 1;
  puVar10[5] = pcVar9;
  *puVar10 = &PTR_disposeImpl_00235c90;
  uStack_70 = 1;
  uStack_c0 = &local_40;
  local_b8 = " == ";
  local_a8 = puVar8 == local_40;
  local_b0 = 5;
  local_78 = puVar8;
  local_68 = puVar10;
  if ((!local_a8) && (_::Debug::minSeverity < 3)) {
    local_c8 = (undefined1  [8])puVar8;
    _::Debug::
    log<char_const(&)[41],kj::_::DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>*,kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>*&>&>
              ((char *)0x1ce,(int)local_c8,severity,macroArgs,params,in_R9);
  }
  local_a8 = local_d4 == 0;
  local_c8 = (undefined1  [8])&local_d4;
  uStack_c0 = (uint **)((ulong)uStack_c0 & 0xffffffff00000000);
  local_b8 = " == ";
  local_b0 = 5;
  if ((!local_a8) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1d4,ERROR,"\"failed: expected \" \"destroyed1 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed1 == 0",
               (DebugComparison<unsigned_int_&,_int> *)local_c8);
  }
  local_a8 = local_cc == 0;
  uStack_c0 = (uint **)((ulong)uStack_c0 & 0xffffffff00000000);
  local_b8 = " == ";
  local_b0 = 5;
  if ((!local_a8) && (_::Debug::minSeverity < 3)) {
    local_c8 = (undefined1  [8])&local_cc;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1d5,ERROR,"\"failed: expected \" \"destroyed2 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed2 == 0",
               (DebugComparison<unsigned_int_&,_int> *)local_c8);
  }
  local_a8 = local_d0 == 0;
  uStack_c0 = (uint **)((ulong)uStack_c0 & 0xffffffff00000000);
  local_b8 = " == ";
  local_b0 = 5;
  local_c8 = (undefined1  [8])&local_d0;
  if ((!local_a8) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1d6,ERROR,"\"failed: expected \" \"destroyed3 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed3 == 0",
               (DebugComparison<unsigned_int_&,_int> *)local_c8);
  }
  local_78 = (uint *)0x0;
  uStack_70 = 0;
  (**(code **)*puVar10)
            (puVar10,puVar8,0x10,1,1,
             ArrayDisposer::
             Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
             ::destruct);
  local_a8 = local_d4 == 1;
  local_c8 = (undefined1  [8])&local_d4;
  uStack_c0._0_4_ = 1;
  local_b8 = " == ";
  local_b0 = 5;
  if ((!local_a8) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1da,ERROR,"\"failed: expected \" \"destroyed1 == 1\", _kjCondition, destroyed1",
               (char (*) [33])"failed: expected destroyed1 == 1",
               (DebugComparison<unsigned_int_&,_int> *)local_c8,(uint *)local_c8);
  }
  local_a8 = local_cc == 2;
  uStack_c0._0_4_ = 2;
  local_b8 = " == ";
  local_b0 = 5;
  if ((!local_a8) && (_::Debug::minSeverity < 3)) {
    local_c8 = (undefined1  [8])&local_cc;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1db,ERROR,"\"failed: expected \" \"destroyed2 == 2\", _kjCondition, destroyed2",
               (char (*) [33])"failed: expected destroyed2 == 2",
               (DebugComparison<unsigned_int_&,_int> *)local_c8,&local_cc);
  }
  local_a8 = local_d0 == 3;
  uStack_c0._0_4_ = 3;
  local_b8 = " == ";
  local_b0 = 5;
  local_c8 = (undefined1  [8])&local_d0;
  if ((!local_a8) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1dc,ERROR,"\"failed: expected \" \"destroyed3 == 3\", _kjCondition, destroyed3",
               (char (*) [33])"failed: expected destroyed3 == 3",
               (DebugComparison<unsigned_int_&,_int> *)local_c8,&local_d0);
  }
  uVar4 = uStack_70;
  puVar8 = local_78;
  if (local_78 != (uint *)0x0) {
    local_78 = (uint *)0x0;
    uStack_70 = 0;
    (**(code **)*local_68)
              (local_68,puVar8,0x10,uVar4,uVar4,
               ArrayDisposer::
               Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
               ::destruct);
  }
  uVar4 = uStack_50;
  puVar8 = local_58;
  if (local_58 != (uint *)0x0) {
    local_58 = (uint *)0x0;
    uStack_50 = 0;
    (**(code **)*local_48)
              (local_48,puVar8,0x10,uVar4,uVar4,
               ArrayDisposer::
               Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
               ::destruct);
  }
  lVar3 = local_88;
  lVar2 = lStack_90;
  lVar1 = local_98;
  if (local_98 != 0) {
    local_98 = 0;
    lStack_90 = 0;
    local_88 = 0;
    (**(code **)*local_80)
              (local_80,lVar1,0x10,lVar2 - lVar1 >> 4,lVar3 - lVar1 >> 4,
               ArrayDisposer::
               Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
               ::destruct);
  }
  return;
}

Assistant:

TEST(Array, AttachNested) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto builder = kj::heapArrayBuilder<Own<DestructionOrderRecorder>>(1);
  builder.add(kj::mv(obj1));
  auto arr = builder.finish();
  auto ptr = arr.begin();

  Array<Own<DestructionOrderRecorder>> combined = arr.attach(kj::mv(obj2)).attach(kj::mv(obj3));

  KJ_EXPECT(combined.begin() == ptr);
  KJ_EXPECT(combined.size() == 1);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}